

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenSIMDLoadStoreLane
          (BinaryenModuleRef module,BinaryenOp op,uint32_t offset,uint32_t align,uint8_t index,
          BinaryenExpressionRef ptr,BinaryenExpressionRef vec,char *memoryName)

{
  SIMDLoadStoreLane *this;
  string_view sVar1;
  
  sVar1 = (string_view)getMemoryName(module,memoryName);
  this = (SIMDLoadStoreLane *)MixedArena::allocSpace(&module->allocator,0x50,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)35>).super_Expression._id =
       SIMDLoadStoreLaneId;
  (this->super_SpecificExpression<(wasm::Expression::Id)35>).super_Expression.type.id = 0;
  (this->memory).super_IString.str._M_len = 0;
  (this->memory).super_IString.str._M_str = (char *)0x0;
  (this->offset).addr = 0;
  (this->align).addr = 0;
  this->op = op;
  (this->offset).addr = (ulong)offset;
  (this->align).addr = (ulong)align;
  this->index = index;
  this->ptr = ptr;
  this->vec = vec;
  wasm::SIMDLoadStoreLane::finalize(this);
  (this->memory).super_IString.str = sVar1;
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenSIMDLoadStoreLane(BinaryenModuleRef module,
                                                BinaryenOp op,
                                                uint32_t offset,
                                                uint32_t align,
                                                uint8_t index,
                                                BinaryenExpressionRef ptr,
                                                BinaryenExpressionRef vec,
                                                const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDLoadStoreLane(SIMDLoadStoreLaneOp(op),
                             Address(offset),
                             Address(align),
                             index,
                             (Expression*)ptr,
                             (Expression*)vec,
                             getMemoryName(module, memoryName)));
}